

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

void rw::instV4d(int type,uint8 *dst,V4d *src,uint32 numVertices,uint32 stride)

{
  undefined8 uVar1;
  
  if (numVertices != 0 && type == 9) {
    do {
      uVar1 = *(undefined8 *)&src->z;
      *(undefined8 *)dst = *(undefined8 *)src;
      *(undefined8 *)(dst + 8) = uVar1;
      dst = dst + stride;
      src = src + 1;
      numVertices = numVertices - 1;
    } while (numVertices != 0);
  }
  return;
}

Assistant:

void
instV4d(int type, uint8 *dst, V4d *src, uint32 numVertices, uint32 stride)
{
	if(type == VERT_FLOAT4)
		for(uint32 i = 0; i < numVertices; i++){
			memcpy(dst, src, 16);
			dst += stride;
			src++;
		}
	else
		assert(0 && "unsupported instV4d type");
}